

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_attr.cpp
# Opt level: O1

void testStringHelper(exr_context_t f)

{
  int iVar1;
  exr_result_t eVar2;
  char *pcVar3;
  ostream *poVar4;
  size_t sVar5;
  char *in_RCX;
  char *pcVar6;
  _internal_exr_context *pctxt;
  exr_attr_string_t s;
  exr_attr_string_t local_38;
  
  if (f == (exr_context_t)0x0) {
    iVar1 = 2;
  }
  else {
    iVar1 = (**(code **)(f + 0x40))(f,3,"Invalid reference to string object to initialize");
  }
  if (iVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_string_init (f, __null, 1)",(char *)0x80,0x17f36b,in_RCX);
  }
  if (f == (exr_context_t)0x0) {
    iVar1 = 2;
  }
  else {
    in_RCX = (char *)0xffffffff;
    iVar1 = (**(code **)(f + 0x48))(f,3,"Received request to allocate negative sized string (%d)");
  }
  if (iVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_string_init (f, &s, -1)",(char *)0x82,0x17f36b,in_RCX);
  }
  eVar2 = exr_attr_string_init_static((exr_context_t)0x0,&local_38,"exr");
  if (eVar2 != 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(2);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_string_init_static (__null, &s, \"exr\")",(char *)0x85,0x17f36b,in_RCX)
    ;
  }
  eVar2 = exr_attr_string_init_static(f,(exr_attr_string_t *)0x0,"exr");
  if (eVar2 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_string_init_static (f, __null, \"exr\")",(char *)0x87,0x17f36b,in_RCX);
  }
  if (f == (exr_context_t)0x0) {
    iVar1 = 2;
  }
  else {
    iVar1 = (**(code **)(f + 0x40))(f,3,"Invalid static string argument to initialize");
  }
  if (iVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_string_init_static (f, &s, __null)",(char *)0x89,0x17f36b,in_RCX);
  }
  if (f == (exr_context_t)0x0) {
    iVar1 = 2;
  }
  else {
    iVar1 = (**(code **)(f + 0x40))(f,3,"Invalid reference to string object to initialize");
  }
  if (iVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_string_init_static_with_length (f, __null, \"exr\", 3)",(char *)0x8f,
                   0x17f36b,in_RCX);
  }
  if (f == (exr_context_t)0x0) {
    iVar1 = 2;
  }
  else {
    iVar1 = (**(code **)(f + 0x40))(f,3,"Invalid static string argument to initialize");
  }
  if (iVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_string_init_static_with_length (f, &s, __null, 4)",(char *)0x92,
                   0x17f36b,in_RCX);
  }
  if (f == (exr_context_t)0x0) {
    iVar1 = 2;
  }
  else {
    in_RCX = (char *)0xfffffffd;
    iVar1 = (**(code **)(f + 0x48))(f,3,"Received request to allocate negative sized string (%d)");
  }
  if (iVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_string_init_static_with_length (f, &s, \"exr\", -3)",(char *)0x95,
                   0x17f36b,in_RCX);
  }
  if (f == (exr_context_t)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(2);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_string_destroy (f, __null)",(char *)0x96,0x17f36b,in_RCX);
  }
  local_38.length = 0;
  local_38.alloc_size = 0;
  local_38.str = (char *)0x0;
  local_38.str = (char *)(**(code **)(f + 0x58))(5);
  if (local_38.str == (char *)0x0) {
    iVar1 = (**(code **)(f + 0x38))(f);
  }
  else {
    local_38.length = 4;
    local_38.alloc_size = 5;
    iVar1 = 0;
  }
  if (iVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_string_init (f, &s, 4)",(char *)0x99,0x17f36b,in_RCX);
  }
  if (local_38.str == (char *)0x0) {
    core_test_fail("s.str != __null",(char *)0x9a,0x17f36b,in_RCX);
  }
  if (local_38.length != 4) {
    core_test_fail("s.length == 4",(char *)0x9b,0x17f36b,in_RCX);
  }
  if (local_38.alloc_size != 5) {
    core_test_fail("s.alloc_size == 5",(char *)0x9c,0x17f36b,in_RCX);
  }
  if (f == (exr_context_t)0x0) {
    iVar1 = 2;
  }
  else {
    if (local_38.str != (char *)0x0) {
      (**(code **)(f + 0x60))();
    }
    local_38.length = 0;
    local_38.alloc_size = 0;
    local_38.str = (char *)0x0;
    iVar1 = 0;
  }
  if (f == (exr_context_t)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_string_destroy (f, &s)",(char *)0x9d,0x17f36b,in_RCX);
  }
  if (local_38.str != (char *)0x0) {
    core_test_fail("s.str == __null",(char *)0x9e,0x17f36b,in_RCX);
  }
  if (local_38.length != 0) {
    core_test_fail("s.length == 0",(char *)0x9f,0x17f36b,in_RCX);
  }
  if (local_38.alloc_size != 0) {
    core_test_fail("s.alloc_size == 0",(char *)0xa0,0x17f36b,in_RCX);
  }
  eVar2 = exr_attr_string_create(f,(exr_attr_string_t *)0x0,"exr");
  if (eVar2 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_string_create (f, __null, \"exr\")",(char *)0xa3,0x17f36b,in_RCX);
  }
  eVar2 = exr_attr_string_create((exr_context_t)0x0,&local_38,"exr");
  if (eVar2 != 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(2);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_string_create (__null, &s, \"exr\")",(char *)0xa5,0x17f36b,in_RCX);
  }
  if (f == (exr_context_t)0x0) {
    iVar1 = 2;
  }
  else {
    local_38.length = 0;
    local_38.alloc_size = 0;
    local_38.str = (char *)0x0;
    local_38.str = (char *)(**(code **)(f + 0x58))(1);
    if (local_38.str == (char *)0x0) {
      iVar1 = (**(code **)(f + 0x38))(f,1);
    }
    else {
      local_38.length = 0;
      local_38.alloc_size = 1;
      iVar1 = 0;
    }
    if (iVar1 == 0) {
      *local_38.str = '\0';
    }
  }
  if (iVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_string_create (f, &s, __null)",(char *)0xa7,0x17f36b,in_RCX);
  }
  if ((local_38.str == (char *)0x0) || (*local_38.str != '\0')) {
    core_test_fail("s.str != __null && s.str[0] == \'\\0\'",(char *)0xa8,0x17f36b,in_RCX);
  }
  if (local_38.length != 0) {
    core_test_fail("s.length == 0",(char *)0xa9,0x17f36b,in_RCX);
  }
  if (local_38.alloc_size != 1) {
    core_test_fail("s.alloc_size == 1",(char *)0xaa,0x17f36b,in_RCX);
  }
  if (f == (exr_context_t)0x0) {
    iVar1 = 2;
  }
  else {
    if (local_38.str != (char *)0x0) {
      (**(code **)(f + 0x60))();
    }
    local_38.length = 0;
    local_38.alloc_size = 0;
    local_38.str = (char *)0x0;
    iVar1 = 0;
  }
  if (f == (exr_context_t)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_string_destroy (f, &s)",(char *)0xab,0x17f36b,in_RCX);
  }
  local_38.length = 0;
  local_38.alloc_size = 0;
  local_38.str = (char *)0x0;
  local_38.str = (char *)(**(code **)(f + 0x58))(0xb);
  if (local_38.str == (char *)0x0) {
    iVar1 = (**(code **)(f + 0x38))(f,1);
  }
  else {
    local_38.length = 10;
    local_38.alloc_size = 0xb;
    iVar1 = 0;
  }
  if (iVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_string_create_with_length (f, &s, __null, 10)",(char *)0xad,0x17f36b,
                   in_RCX);
  }
  local_38.str[7] = '\0';
  local_38.str[8] = '\0';
  local_38.str[9] = '\0';
  local_38.str[10] = '\0';
  local_38.str[0] = '\0';
  local_38.str[1] = '\0';
  local_38.str[2] = '\0';
  local_38.str[3] = '\0';
  local_38.str[4] = '\0';
  local_38.str[5] = '\0';
  local_38.str[6] = '\0';
  local_38.str[7] = '\0';
  if ((local_38.str == (char *)0x0) || (*local_38.str != '\0')) {
    core_test_fail("s.str != __null && s.str[0] == \'\\0\'",(char *)0xae,0x17f36b,in_RCX);
  }
  if (local_38.length != 10) {
    core_test_fail("s.length == 10",(char *)0xaf,0x17f36b,in_RCX);
  }
  if (local_38.alloc_size != 0xb) {
    core_test_fail("s.alloc_size == 11",(char *)0xb0,0x17f36b,in_RCX);
  }
  if (f == (exr_context_t)0x0) {
    iVar1 = 2;
  }
  else {
    if (local_38.str != (char *)0x0) {
      (**(code **)(f + 0x60))();
    }
    local_38.length = 0;
    local_38.alloc_size = 0;
    local_38.str = (char *)0x0;
    iVar1 = 0;
  }
  if (f == (exr_context_t)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_string_destroy (f, &s)",(char *)0xb1,0x17f36b,in_RCX);
  }
  s_malloc_fail_on = 1;
  eVar2 = exr_attr_string_create(f,&local_38,"exr");
  s_malloc_fail_on = 0;
  if (eVar2 != 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_string_create (f, &s, \"exr\")",(char *)0xb4,0x17f36b,in_RCX);
  }
  if (f == (exr_context_t)0x0) {
    iVar1 = 2;
  }
  else {
    if ((local_38.str != (char *)0x0) && (0 < local_38.alloc_size)) {
      (**(code **)(f + 0x60))();
    }
    local_38.length = 0;
    local_38.alloc_size = 0;
    local_38.str = (char *)0x0;
    iVar1 = 0;
  }
  if (f == (exr_context_t)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_string_destroy (f, &s)",(char *)0xb5,0x17f36b,in_RCX);
  }
  eVar2 = exr_attr_string_create(f,&local_38,"exr");
  if (eVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_string_create (f, &s, \"exr\")",(char *)0xb7,0x17f36b,in_RCX);
  }
  if ((local_38.str == (char *)0x0) || (iVar1 = strcmp(local_38.str,"exr"), iVar1 != 0)) {
    core_test_fail("s.str != __null && !strcmp (s.str, \"exr\")",(char *)0xb8,0x17f36b,in_RCX);
  }
  if (local_38.length != 3) {
    core_test_fail("s.length == 3",(char *)0xb9,0x17f36b,in_RCX);
  }
  if (local_38.alloc_size != 4) {
    core_test_fail("s.alloc_size == 4",(char *)0xba,0x17f36b,in_RCX);
  }
  eVar2 = exr_attr_string_set(f,(exr_attr_string_t *)0x0,"exr");
  if (eVar2 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_string_set (f, __null, \"exr\")",(char *)0xbd,0x17f36b,in_RCX);
  }
  eVar2 = exr_attr_string_set((exr_context_t)0x0,&local_38,"exr");
  if (eVar2 != 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(2);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_string_set (__null, &s, \"exr\")",(char *)0xbf,0x17f36b,in_RCX);
  }
  eVar2 = exr_attr_string_set(f,&local_38,"openexr");
  if (eVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_string_set (f, &s, \"openexr\")",(char *)0xc1,0x17f36b,in_RCX);
  }
  if ((local_38.str == (char *)0x0) || (iVar1 = strcmp(local_38.str,"openexr"), iVar1 != 0)) {
    core_test_fail("s.str != __null && !strcmp (s.str, \"openexr\")",(char *)0xc2,0x17f36b,in_RCX);
  }
  if (local_38.length != 7) {
    core_test_fail("s.length == 7",(char *)0xc3,0x17f36b,in_RCX);
  }
  if (local_38.alloc_size != 8) {
    core_test_fail("s.alloc_size == 8",(char *)0xc4,0x17f36b,in_RCX);
  }
  pcVar6 = (char *)0x3;
  eVar2 = exr_attr_string_set_with_length(f,&local_38,"exr",3);
  if (eVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar3 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_string_set_with_length (f, &s, \"exr\", 3)",(char *)0xc6,0x17f36b,
                   pcVar6);
  }
  if ((local_38.str == (char *)0x0) || (iVar1 = strcmp(local_38.str,"exr"), iVar1 != 0)) {
    core_test_fail("s.str != __null && !strcmp (s.str, \"exr\")",(char *)0xc7,0x17f36b,pcVar6);
  }
  if (local_38.length != 3) {
    core_test_fail("s.length == 3",(char *)0xc8,0x17f36b,pcVar6);
  }
  if (local_38.alloc_size != 8) {
    core_test_fail("s.alloc_size == 8",(char *)0xc9,0x17f36b,pcVar6);
  }
  pcVar6 = (char *)0x3;
  eVar2 = exr_attr_string_set_with_length(f,&local_38,"exropenexr",3);
  if (eVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar3 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_string_set_with_length (f, &s, \"exropenexr\", 3)",(char *)0xcc,
                   0x17f36b,pcVar6);
  }
  if ((local_38.str == (char *)0x0) || (iVar1 = strcmp(local_38.str,"exr"), iVar1 != 0)) {
    core_test_fail("s.str != __null && !strcmp (s.str, \"exr\")",(char *)0xcd,0x17f36b,pcVar6);
  }
  if (local_38.length != 3) {
    core_test_fail("s.length == 3",(char *)0xce,0x17f36b,pcVar6);
  }
  if (local_38.alloc_size != 8) {
    core_test_fail("s.alloc_size == 8",(char *)0xcf,0x17f36b,pcVar6);
  }
  pcVar6 = (char *)0x3;
  eVar2 = exr_attr_string_set_with_length(f,&local_38,(char *)0x0,3);
  if (eVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar3 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_string_set_with_length (f, &s, __null, 3)",(char *)0xd1,0x17f36b,pcVar6
                  );
  }
  if ((((local_38.str == (char *)0x0) || (*local_38.str != '\0')) || (local_38.str[1] != '\0')) ||
     (local_38.str[2] != '\0')) {
    core_test_fail("s.str != __null && s.str[0] == \'\\0\' && s.str[1] == \'\\0\' && s.str[2] == \'\\0\'"
                   ,(char *)0xd4,0x17f36b,pcVar6);
  }
  if (local_38.length != 3) {
    core_test_fail("s.length == 3",(char *)0xd5,0x17f36b,pcVar6);
  }
  pcVar6 = (char *)0x3;
  if (local_38.str[3] != '\0') {
    core_test_fail("s.str[s.length] == \'\\0\'",(char *)0xd6,0x17f36b,(char *)0x3);
  }
  if (local_38.alloc_size != 8) {
    core_test_fail("s.alloc_size == 8",(char *)0xd7,0x17f36b,(char *)0x3);
  }
  if (f == (exr_context_t)0x0) {
    iVar1 = 2;
  }
  else {
    if (local_38.str != (char *)0x0) {
      (**(code **)(f + 0x60))();
    }
    local_38.length = 0;
    local_38.alloc_size = 0;
    local_38.str = (char *)0x0;
    iVar1 = 0;
  }
  if (f == (exr_context_t)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_string_destroy (f, &s)",(char *)0xd9,0x17f36b,pcVar6);
  }
  pcVar6 = (char *)0x6;
  eVar2 = exr_attr_string_create_with_length(f,&local_38,"exr",6);
  if (eVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar3 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_string_create_with_length (f, &s, \"exr\", 6)",(char *)0xdb,0x17f36b,
                   pcVar6);
  }
  if ((local_38.str == (char *)0x0) || (iVar1 = strcmp(local_38.str,"exr"), iVar1 != 0)) {
    core_test_fail("s.str != __null && !strcmp (s.str, \"exr\")",(char *)0xdc,0x17f36b,pcVar6);
  }
  if (local_38.length != 6) {
    core_test_fail("s.length == 6",(char *)0xdd,0x17f36b,pcVar6);
  }
  if (local_38.alloc_size != 7) {
    core_test_fail("s.alloc_size == 7",(char *)0xde,0x17f36b,pcVar6);
  }
  if (f == (exr_context_t)0x0) {
    iVar1 = 2;
  }
  else {
    if (local_38.str != (char *)0x0) {
      (**(code **)(f + 0x60))();
    }
    local_38.length = 0;
    local_38.alloc_size = 0;
    local_38.str = (char *)0x0;
    iVar1 = 0;
  }
  if (f == (exr_context_t)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_string_destroy (f, &s)",(char *)0xdf,0x17f36b,pcVar6);
  }
  pcVar6 = (char *)0x3;
  eVar2 = exr_attr_string_create_with_length(f,&local_38,"openexr",3);
  if (eVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar3 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_string_create_with_length (f, &s, \"openexr\", 3)",(char *)0xe2,
                   0x17f36b,pcVar6);
  }
  if ((local_38.str == (char *)0x0) || (iVar1 = strcmp(local_38.str,"ope"), iVar1 != 0)) {
    core_test_fail("s.str != __null && !strcmp (s.str, \"ope\")",(char *)0xe3,0x17f36b,pcVar6);
  }
  if (local_38.length != 3) {
    core_test_fail("s.length == 3",(char *)0xe4,0x17f36b,pcVar6);
  }
  if (local_38.alloc_size != 4) {
    core_test_fail("s.alloc_size == 4",(char *)0xe5,0x17f36b,pcVar6);
  }
  if (f == (exr_context_t)0x0) {
    iVar1 = 2;
  }
  else {
    if (local_38.str != (char *)0x0) {
      (**(code **)(f + 0x60))();
    }
    local_38.length = 0;
    local_38.alloc_size = 0;
    local_38.str = (char *)0x0;
    iVar1 = 0;
  }
  if (f == (exr_context_t)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_string_destroy (f, &s)",(char *)0xe6,0x17f36b,pcVar6);
  }
  eVar2 = exr_attr_string_init_static(f,&local_38,"exr");
  if (eVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar3 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_string_init_static (f, &s, \"exr\")",(char *)0xe8,0x17f36b,pcVar6);
  }
  if ((local_38.str == (char *)0x0) || (iVar1 = strcmp(local_38.str,"exr"), iVar1 != 0)) {
    core_test_fail("s.str != __null && !strcmp (s.str, \"exr\")",(char *)0xe9,0x17f36b,pcVar6);
  }
  if (local_38.length != 3) {
    core_test_fail("s.length == 3",(char *)0xea,0x17f36b,pcVar6);
  }
  if (local_38.alloc_size != 0) {
    core_test_fail("s.alloc_size == 0",(char *)0xeb,0x17f36b,pcVar6);
  }
  if (f == (exr_context_t)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar3 = (char *)exr_get_default_error_message(2);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_string_destroy (f, &s)",(char *)0xec,0x17f36b,pcVar6);
  }
  local_38.length = 0;
  local_38.alloc_size = 0;
  local_38.str = (char *)0x0;
  if (f == (exr_context_t)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar3 = (char *)exr_get_default_error_message(2);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_string_init_static_with_length (f, &s, \"openexr\", 7)",(char *)0xf2,
                   0x17f36b,pcVar6);
  }
  local_38.length = 7;
  local_38.alloc_size = 0;
  local_38.str = "openexr";
  iVar1 = strcmp("openexr","openexr");
  if (iVar1 != 0) {
    core_test_fail("s.str != __null && !strcmp (s.str, \"openexr\")",(char *)0xf3,0x17f36b,pcVar6);
  }
  if (local_38.length != 7) {
    core_test_fail("s.length == 7",(char *)0xf4,0x17f36b,pcVar6);
  }
  if (local_38.alloc_size != 0) {
    core_test_fail("s.alloc_size == 0",(char *)0xf5,0x17f36b,pcVar6);
  }
  if (f != (exr_context_t)0x0) {
    local_38.length = 0;
    local_38.alloc_size = 0;
    local_38.str = (char *)0x0;
    if (f == (exr_context_t)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(0);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
      }
      else {
        sVar5 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      core_test_fail("exr_attr_string_destroy (f, &s)",(char *)0xf8,0x17f36b,pcVar6);
    }
    pcVar3 = (char *)malloc(0x80000001);
    if (pcVar3 != (char *)0x0) {
      memset(pcVar3,0x42,0x80000000);
      pcVar3[0x80000000] = '\0';
      eVar2 = exr_attr_string_init_static((exr_context_t)0x0,&local_38,pcVar3);
      if (eVar2 != 2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
        pcVar3 = (char *)exr_get_default_error_message(eVar2);
        if (pcVar3 == (char *)0x0) {
          std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
        }
        else {
          sVar5 = strlen(pcVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
        pcVar3 = (char *)exr_get_default_error_message(2);
        if (pcVar3 == (char *)0x0) {
          std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
        }
        else {
          sVar5 = strlen(pcVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        core_test_fail("exr_attr_string_init_static (__null, &s, tmp)",(char *)0x104,0x17f36b,pcVar6
                      );
      }
      eVar2 = exr_attr_string_init_static(f,&local_38,pcVar3);
      if (eVar2 != 3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
        pcVar3 = (char *)exr_get_default_error_message(eVar2);
        if (pcVar3 == (char *)0x0) {
          std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
        }
        else {
          sVar5 = strlen(pcVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
        pcVar3 = (char *)exr_get_default_error_message(3);
        if (pcVar3 == (char *)0x0) {
          std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
        }
        else {
          sVar5 = strlen(pcVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        core_test_fail("exr_attr_string_init_static (f, &s, tmp)",(char *)0x106,0x17f36b,pcVar6);
      }
      eVar2 = exr_attr_string_create((exr_context_t)0x0,&local_38,pcVar3);
      if (eVar2 != 2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
        pcVar3 = (char *)exr_get_default_error_message(eVar2);
        if (pcVar3 == (char *)0x0) {
          std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
        }
        else {
          sVar5 = strlen(pcVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
        pcVar3 = (char *)exr_get_default_error_message(2);
        if (pcVar3 == (char *)0x0) {
          std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
        }
        else {
          sVar5 = strlen(pcVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        core_test_fail("exr_attr_string_create (__null, &s, tmp)",(char *)0x10a,0x17f36b,pcVar6);
      }
      eVar2 = exr_attr_string_create(f,&local_38,pcVar3);
      if (eVar2 != 3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
        pcVar3 = (char *)exr_get_default_error_message(eVar2);
        if (pcVar3 == (char *)0x0) {
          std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
        }
        else {
          sVar5 = strlen(pcVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
        pcVar3 = (char *)exr_get_default_error_message(3);
        if (pcVar3 == (char *)0x0) {
          std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
        }
        else {
          sVar5 = strlen(pcVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        core_test_fail("exr_attr_string_create (f, &s, tmp)",(char *)0x10c,0x17f36b,pcVar6);
      }
      eVar2 = exr_attr_string_set((exr_context_t)0x0,&local_38,pcVar3);
      if (eVar2 != 2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
        pcVar3 = (char *)exr_get_default_error_message(eVar2);
        if (pcVar3 == (char *)0x0) {
          std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
        }
        else {
          sVar5 = strlen(pcVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
        pcVar3 = (char *)exr_get_default_error_message(2);
        if (pcVar3 == (char *)0x0) {
          std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
        }
        else {
          sVar5 = strlen(pcVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        core_test_fail("exr_attr_string_set (__null, &s, tmp)",(char *)0x10f,0x17f36b,pcVar6);
      }
      eVar2 = exr_attr_string_set(f,&local_38,pcVar3);
      if (eVar2 != 3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
        pcVar3 = (char *)exr_get_default_error_message(eVar2);
        if (pcVar3 == (char *)0x0) {
          std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
        }
        else {
          sVar5 = strlen(pcVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
        pcVar3 = (char *)exr_get_default_error_message(3);
        if (pcVar3 == (char *)0x0) {
          std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
        }
        else {
          sVar5 = strlen(pcVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        core_test_fail("exr_attr_string_set (f, &s, tmp)",(char *)0x111,0x17f36b,pcVar6);
      }
      free(pcVar3);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
  pcVar3 = (char *)exr_get_default_error_message(2);
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
  }
  else {
    sVar5 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  core_test_fail("exr_attr_string_destroy (f, &s)",(char *)0xf6,0x17f36b,pcVar6);
}

Assistant:

static void
testStringHelper (exr_context_t f)
{
    exr_attr_string_t s, nil = {0};

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG, exr_attr_string_init (NULL, &s, 1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG, exr_attr_string_destroy (NULL, &s));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_string_init (f, NULL, 1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_string_init (f, &s, -1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_string_init_static (NULL, &s, "exr"));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_string_init_static (f, NULL, "exr"));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_string_init_static (f, &s, NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_string_init_static_with_length (NULL, &s, "exr", 3));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_init_static_with_length (f, NULL, "exr", 3));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_init_static_with_length (f, &s, NULL, 4));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_init_static_with_length (f, &s, "exr", -3));
    EXRCORE_TEST_RVAL (exr_attr_string_destroy (f, NULL));
    EXRCORE_TEST_RVAL (exr_attr_string_destroy (f, &nil));

    EXRCORE_TEST_RVAL (exr_attr_string_init (f, &s, 4));
    EXRCORE_TEST (s.str != NULL);
    EXRCORE_TEST (s.length == 4);
    EXRCORE_TEST (s.alloc_size == 5);
    EXRCORE_TEST_RVAL (exr_attr_string_destroy (f, &s));
    EXRCORE_TEST (s.str == NULL);
    EXRCORE_TEST (s.length == 0);
    EXRCORE_TEST (s.alloc_size == 0);

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_string_create (f, NULL, "exr"));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG, exr_attr_string_create (NULL, &s, "exr"));

    EXRCORE_TEST_RVAL (exr_attr_string_create (f, &s, NULL));
    EXRCORE_TEST (s.str != NULL && s.str[0] == '\0');
    EXRCORE_TEST (s.length == 0);
    EXRCORE_TEST (s.alloc_size == 1);
    EXRCORE_TEST_RVAL (exr_attr_string_destroy (f, &s));

    EXRCORE_TEST_RVAL (exr_attr_string_create_with_length (f, &s, NULL, 10));
    EXRCORE_TEST (s.str != NULL && s.str[0] == '\0');
    EXRCORE_TEST (s.length == 10);
    EXRCORE_TEST (s.alloc_size == 11);
    EXRCORE_TEST_RVAL (exr_attr_string_destroy (f, &s));

    EXRCORE_TEST_RVAL_FAIL_MALLOC (
        EXR_ERR_OUT_OF_MEMORY, exr_attr_string_create (f, &s, "exr"));
    EXRCORE_TEST_RVAL (exr_attr_string_destroy (f, &s));

    EXRCORE_TEST_RVAL (exr_attr_string_create (f, &s, "exr"));
    EXRCORE_TEST (s.str != NULL && !strcmp (s.str, "exr"));
    EXRCORE_TEST (s.length == 3);
    EXRCORE_TEST (s.alloc_size == 4);

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_string_set (f, NULL, "exr"));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG, exr_attr_string_set (NULL, &s, "exr"));

    EXRCORE_TEST_RVAL (exr_attr_string_set (f, &s, "openexr"));
    EXRCORE_TEST (s.str != NULL && !strcmp (s.str, "openexr"));
    EXRCORE_TEST (s.length == 7);
    EXRCORE_TEST (s.alloc_size == 8);

    EXRCORE_TEST_RVAL (exr_attr_string_set_with_length (f, &s, "exr", 3));
    EXRCORE_TEST (s.str != NULL && !strcmp (s.str, "exr"));
    EXRCORE_TEST (s.length == 3);
    EXRCORE_TEST (s.alloc_size == 8);

    EXRCORE_TEST_RVAL (
        exr_attr_string_set_with_length (f, &s, "exropenexr", 3));
    EXRCORE_TEST (s.str != NULL && !strcmp (s.str, "exr"));
    EXRCORE_TEST (s.length == 3);
    EXRCORE_TEST (s.alloc_size == 8);

    EXRCORE_TEST_RVAL (exr_attr_string_set_with_length (f, &s, NULL, 3));
    EXRCORE_TEST (
        s.str != NULL && s.str[0] == '\0' && s.str[1] == '\0' &&
        s.str[2] == '\0');
    EXRCORE_TEST (s.length == 3);
    EXRCORE_TEST (s.str[s.length] == '\0');
    EXRCORE_TEST (s.alloc_size == 8);

    EXRCORE_TEST_RVAL (exr_attr_string_destroy (f, &s));

    EXRCORE_TEST_RVAL (exr_attr_string_create_with_length (f, &s, "exr", 6));
    EXRCORE_TEST (s.str != NULL && !strcmp (s.str, "exr"));
    EXRCORE_TEST (s.length == 6);
    EXRCORE_TEST (s.alloc_size == 7);
    EXRCORE_TEST_RVAL (exr_attr_string_destroy (f, &s));

    EXRCORE_TEST_RVAL (
        exr_attr_string_create_with_length (f, &s, "openexr", 3));
    EXRCORE_TEST (s.str != NULL && !strcmp (s.str, "ope"));
    EXRCORE_TEST (s.length == 3);
    EXRCORE_TEST (s.alloc_size == 4);
    EXRCORE_TEST_RVAL (exr_attr_string_destroy (f, &s));

    EXRCORE_TEST_RVAL (exr_attr_string_init_static (f, &s, "exr"));
    EXRCORE_TEST (s.str != NULL && !strcmp (s.str, "exr"));
    EXRCORE_TEST (s.length == 3);
    EXRCORE_TEST (s.alloc_size == 0);
    EXRCORE_TEST_RVAL (exr_attr_string_destroy (f, &s));
    EXRCORE_TEST (s.str == NULL);
    EXRCORE_TEST (s.length == 0);
    EXRCORE_TEST (s.alloc_size == 0);

    EXRCORE_TEST_RVAL (
        exr_attr_string_init_static_with_length (f, &s, "openexr", 7));
    EXRCORE_TEST (s.str != NULL && !strcmp (s.str, "openexr"));
    EXRCORE_TEST (s.length == 7);
    EXRCORE_TEST (s.alloc_size == 0);
    EXRCORE_TEST_RVAL (exr_attr_string_destroy (f, &s));
    // make sure we can re-delete something?
    EXRCORE_TEST_RVAL (exr_attr_string_destroy (f, &s));

    size_t nbytes = (size_t) INT32_MAX + 1;
    char*  tmp    = (char*) malloc (nbytes + 1);
    // might be on a low memory machine, in which case just skip the test
    if (tmp)
    {
        memset (tmp, 'B', nbytes);
        tmp[nbytes] = '\0';

        EXRCORE_TEST_RVAL_FAIL (
            EXR_ERR_MISSING_CONTEXT_ARG,
            exr_attr_string_init_static (NULL, &s, tmp));
        EXRCORE_TEST_RVAL_FAIL (
            EXR_ERR_INVALID_ARGUMENT, exr_attr_string_init_static (f, &s, tmp));

        EXRCORE_TEST_RVAL_FAIL (
            EXR_ERR_MISSING_CONTEXT_ARG,
            exr_attr_string_create (NULL, &s, tmp));
        EXRCORE_TEST_RVAL_FAIL (
            EXR_ERR_INVALID_ARGUMENT, exr_attr_string_create (f, &s, tmp));

        EXRCORE_TEST_RVAL_FAIL (
            EXR_ERR_MISSING_CONTEXT_ARG, exr_attr_string_set (NULL, &s, tmp));
        EXRCORE_TEST_RVAL_FAIL (
            EXR_ERR_INVALID_ARGUMENT, exr_attr_string_set (f, &s, tmp));
        free (tmp);
    }
}